

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O3

_Bool borg_cave_floor_grid(borg_grid *ag)

{
  return (_Bool)((byte)(0x180007b >> (ag->feat & 0x1f)) & ag->feat < 0x19);
}

Assistant:

bool borg_cave_floor_grid(borg_grid *ag)
{
    if (ag->feat == FEAT_NONE || ag->feat == FEAT_FLOOR || ag->feat == FEAT_OPEN
        || ag->feat == FEAT_MORE || ag->feat == FEAT_LESS
        || ag->feat == FEAT_BROKEN || ag->feat == FEAT_PASS_RUBBLE
        || ag->feat == FEAT_LAVA)
        return true;
    return false;
}